

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

int get_tilemap_x(dbg_layer_t layer)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  BGCNT_t *pBVar5;
  long lVar6;
  ushort uVar7;
  ulong uVar8;
  dbg_layer_t layer_00;
  dbg_layer_t layer_01;
  long lVar9;
  ulong uVar10;
  ushort auStack_848 [1028];
  ulong uStack_40;
  
  uVar10 = (ulong)layer;
  pBVar5 = get_bgcnt(layer);
  uVar7 = (ppu->DISPCNT).raw & 7;
  if (uVar7 != 1) {
    if (uVar7 != 2) goto LAB_0011d533;
    layer = layer & ~BG1;
  }
  if (layer != BG2) {
LAB_0011d533:
    return *(int *)(&DAT_001285f0 + (ulong)(pBVar5->raw >> 0xe) * 4);
  }
  get_tilemap_x_cold_1();
  layer_00 = (dbg_layer_t)uVar10;
  uVar10 = uVar10 & 0xffffffff;
  layer_01 = layer_00;
  pBVar5 = get_bgcnt(layer_00);
  uVar7 = (ppu->DISPCNT).raw & 7;
  if (uVar7 != 1) {
    if (uVar7 != 2) goto LAB_0011d578;
    uVar10 = (ulong)(layer_00 & ~BG1);
  }
  if ((int)uVar10 == 2) {
    get_tilemap_y_cold_1();
    uStack_40 = uVar10;
    uVar2 = get_tilemap_x(layer_01);
    uVar3 = get_tilemap_y(layer_01);
    pBVar5 = get_bgcnt(layer_01);
    uVar10 = 0;
    memset(dbg_tilemap,0,0x400000);
    lVar9 = 0x1461c3;
    do {
      uVar8 = 0;
      do {
        if ((uVar8 <= uVar2) && (uVar10 <= uVar3)) {
          iVar4 = (*(code *)(&DAT_00128614 +
                            *(int *)(&DAT_00128614 + (ulong)(pBVar5->raw >> 0xe) * 4)))();
          return iVar4;
        }
        auStack_848[uVar8] = auStack_848[uVar8] & 0x8000;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x400);
      lVar6 = 0;
      do {
        uVar7 = auStack_848[lVar6];
        *(byte *)(lVar9 + -2 + lVar6 * 4) = ((byte)uVar7 & 7) + (byte)uVar7 * '\b';
        bVar1 = (byte)(uVar7 >> 5);
        *(byte *)(lVar9 + -1 + lVar6 * 4) = (bVar1 & 7) + bVar1 * '\b';
        bVar1 = (byte)(uVar7 >> 8);
        *(byte *)(lVar9 + lVar6 * 4) = (bVar1 >> 2 & 7) + (bVar1 >> 2) * '\b';
        *(undefined1 *)(lVar9 + -3 + lVar6 * 4) = 0xff;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x400);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x1000;
    } while (uVar10 != 0x400);
    iVar4 = SDL_UpdateTexture(dbg_tilemap_texture,0,dbg_tilemap,0x1000);
    return iVar4;
  }
LAB_0011d578:
  return *(int *)(&DAT_00128600 + (ulong)(pBVar5->raw >> 0xe) * 4);
}

Assistant:

int get_tilemap_x(dbg_layer_t layer) {
    BGCNT_t* bgcnt = get_bgcnt(layer);
    if (is_layer_affine(layer)) {
        logfatal("aaa")
    } else {
        switch (bgcnt->screen_size) {
            case 0:
                return 256;
            case 1:
                return 512;
            case 2:
                return 256;
            case 3:
                return 512;
            default:
                logfatal("Invalid screen size: %d", bgcnt->screen_size)
        }
    }
}